

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::resizeEvent(QWizard *this,QResizeEvent *event)

{
  QWidget::resize(*(QWidget **)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x468),
                  *(int *)(event + 0x10),*(int *)(event + 0x14));
  QDialog::resizeEvent(&this->super_QDialog,event);
  return;
}

Assistant:

void QWizard::resizeEvent(QResizeEvent *event)
{
    Q_D(QWizard);
    int heightOffset = 0;
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled()) {
        heightOffset = d->vistaHelper->topOffset(this);
        heightOffset += d->vistaHelper->titleBarSize();
    }
#endif
    d->antiFlickerWidget->resize(event->size().width(), event->size().height() - heightOffset);
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled())
        d->vistaHelper->resizeEvent(event);
#endif
    QDialog::resizeEvent(event);
}